

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_0::HaveSameIndexesExceptForLast
               (Instruction *inst_1,Instruction *inst_2)

{
  bool bVar1;
  Op OVar2;
  Op OVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint local_28;
  uint32_t i;
  uint32_t first_index_position;
  Instruction *inst_2_local;
  Instruction *inst_1_local;
  
  OVar2 = Instruction::opcode(inst_1);
  OVar3 = Instruction::opcode(inst_2);
  if (OVar2 != OVar3) {
    __assert_fail("inst_1->opcode() == inst_2->opcode() && \"Expecting the opcodes to be the same.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x6b8,
                  "bool spvtools::opt::(anonymous namespace)::HaveSameIndexesExceptForLast(Instruction *, Instruction *)"
                 );
  }
  OVar2 = Instruction::opcode(inst_1);
  if (OVar2 != OpCompositeInsert) {
    OVar2 = Instruction::opcode(inst_1);
    bVar1 = false;
    if (OVar2 != OpCompositeExtract) goto LAB_00378e6e;
  }
  bVar1 = true;
LAB_00378e6e:
  if (!bVar1) {
    __assert_fail("(inst_1->opcode() == spv::Op::OpCompositeInsert || inst_1->opcode() == spv::Op::OpCompositeExtract) && \"Instructions must be OpCompositeInsert or OpCompositeExtract.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x6bb,
                  "bool spvtools::opt::(anonymous namespace)::HaveSameIndexesExceptForLast(Instruction *, Instruction *)"
                 );
  }
  uVar4 = Instruction::NumInOperands(inst_1);
  uVar5 = Instruction::NumInOperands(inst_2);
  if (uVar4 == uVar5) {
    OVar2 = Instruction::opcode(inst_1);
    local_28 = 1;
    if (OVar2 == OpCompositeInsert) {
      local_28 = 2;
    }
    for (; uVar4 = Instruction::NumInOperands(inst_1), local_28 < uVar4 - 1; local_28 = local_28 + 1
        ) {
      uVar4 = Instruction::GetSingleWordInOperand(inst_1,local_28);
      uVar5 = Instruction::GetSingleWordInOperand(inst_2,local_28);
      if (uVar4 != uVar5) {
        return false;
      }
    }
    inst_1_local._7_1_ = true;
  }
  else {
    inst_1_local._7_1_ = false;
  }
  return inst_1_local._7_1_;
}

Assistant:

bool HaveSameIndexesExceptForLast(Instruction* inst_1, Instruction* inst_2) {
  assert(inst_1->opcode() == inst_2->opcode() &&
         "Expecting the opcodes to be the same.");
  assert((inst_1->opcode() == spv::Op::OpCompositeInsert ||
          inst_1->opcode() == spv::Op::OpCompositeExtract) &&
         "Instructions must be OpCompositeInsert or OpCompositeExtract.");

  if (inst_1->NumInOperands() != inst_2->NumInOperands()) {
    return false;
  }

  uint32_t first_index_position =
      (inst_1->opcode() == spv::Op::OpCompositeInsert ? 2 : 1);
  for (uint32_t i = first_index_position; i < inst_1->NumInOperands() - 1;
       i++) {
    if (inst_1->GetSingleWordInOperand(i) !=
        inst_2->GetSingleWordInOperand(i)) {
      return false;
    }
  }
  return true;
}